

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covInt.h
# Opt level: O2

int Min_CubeIsContained(Min_Cube_t *pCube0,Min_Cube_t *pCube1)

{
  uint *puVar1;
  uint *puVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    if ((*(uint *)&pCube0->field_0x8 >> 10 & 0xfff) == uVar3) {
      return 1;
    }
    puVar1 = pCube0->uData + uVar3;
    puVar2 = pCube1->uData + uVar3;
    uVar3 = uVar3 + 1;
  } while ((*puVar2 & ~*puVar1) == 0);
  return 0;
}

Assistant:

static inline int Min_CubeIsContained( Min_Cube_t * pCube0, Min_Cube_t * pCube1 )
{
    int i;
    for ( i = 0; i < (int)pCube0->nWords; i++ )
        if ( (pCube0->uData[i] & pCube1->uData[i]) != pCube1->uData[i] )
            return 0;
    return 1;
}